

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_insert(REF_GRID *iso_grid_ptr,REF_GRID ref_grid,REF_DBL *field,REF_INT ldim,REF_DBL *in,
              REF_DBL **out)

{
  REF_CELL pRVar1;
  bool bVar2;
  uint uVar3;
  REF_STATUS RVar4;
  double dVar5;
  double local_2c8;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_BOOL found;
  REF_INT tri_nodes [27];
  REF_INT nedge;
  REF_INT edge_nodes [6];
  int local_1e4;
  REF_INT cell_edge;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT id;
  REF_INT new_nodes [27];
  REF_INT local_124;
  REF_INT nodes [27];
  int local_b4;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_DBL d;
  REF_DBL t0;
  REF_DBL t1;
  REF_GLOB global;
  int local_80;
  REF_INT edge2;
  REF_INT edge1;
  REF_INT edge0;
  REF_INT node2;
  REF_INT node1;
  REF_INT node0;
  REF_INT new_cell;
  REF_INT part;
  REF_INT edge;
  REF_INT *new_node;
  REF_EDGE ref_edge;
  REF_GRID iso_grid;
  REF_MPI ref_mpi;
  REF_DBL **out_local;
  REF_DBL *in_local;
  REF_DBL *pRStack_28;
  REF_INT ldim_local;
  REF_DBL *field_local;
  REF_GRID ref_grid_local;
  REF_GRID *iso_grid_ptr_local;
  
  iso_grid = (REF_GRID)ref_grid->mpi;
  ref_mpi = (REF_MPI)out;
  out_local = (REF_DBL **)in;
  in_local._4_4_ = ldim;
  pRStack_28 = field;
  field_local = (REF_DBL *)ref_grid;
  ref_grid_local = (REF_GRID)iso_grid_ptr;
  uVar3 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar3 == 0) {
    uVar3 = ref_grid_create((REF_GRID *)ref_grid_local,(REF_MPI)iso_grid);
    if (uVar3 == 0) {
      ref_edge = (REF_EDGE)ref_grid_local->mpi;
      uVar3 = ref_node_initialize_n_global(*(REF_NODE *)&((REF_MPI)ref_edge)->max_tag,0);
      if (uVar3 == 0) {
        uVar3 = ref_edge_create((REF_EDGE *)&new_node,(REF_GRID)field_local);
        if (uVar3 == 0) {
          if (*new_node < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0xa6,"ref_iso_insert","malloc new_node of REF_INT negative");
            iso_grid_ptr_local._4_4_ = 1;
          }
          else {
            _part = (REF_INT *)malloc((long)*new_node << 2);
            if (_part == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0xa6,"ref_iso_insert","malloc new_node of REF_INT NULL");
              iso_grid_ptr_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_5 = 0; ref_private_macro_code_rss_5 < *new_node;
                  ref_private_macro_code_rss_5 = ref_private_macro_code_rss_5 + 1) {
                _part[ref_private_macro_code_rss_5] = -1;
              }
              for (new_cell = 0; new_cell < *new_node; new_cell = new_cell + 1) {
                node2 = *(REF_INT *)(*(long *)(new_node + 2) + (long)(new_cell << 1) * 4);
                edge0 = *(REF_INT *)(*(long *)(new_node + 2) + (long)(new_cell * 2 + 1) * 4);
                uVar3 = ref_edge_part((REF_EDGE)new_node,new_cell,&node0);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0xab,"ref_iso_insert",(ulong)uVar3,"edge part");
                  return uVar3;
                }
                if (*(int *)((long)&iso_grid->mpi + 4) == node0) {
                  if (pRStack_28[node2] < pRStack_28[edge0] ||
                      pRStack_28[node2] == pRStack_28[edge0]) {
                    local_2a8 = pRStack_28[edge0];
                  }
                  else {
                    local_2a8 = pRStack_28[node2];
                  }
                  if (0.0 < local_2a8) {
                    if (pRStack_28[edge0] <= pRStack_28[node2]) {
                      local_2b0 = pRStack_28[edge0];
                    }
                    else {
                      local_2b0 = pRStack_28[node2];
                    }
                    if (local_2b0 < 0.0) {
                      uVar3 = ref_node_next_global((REF_NODE)ref_edge->e2n,(REF_GLOB *)&t1);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0xb0,"ref_iso_insert",(ulong)uVar3,"next global");
                        return uVar3;
                      }
                      uVar3 = ref_node_add((REF_NODE)ref_edge->e2n,(REF_GLOB)t1,_part + new_cell);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                               ,0xb2,"ref_iso_insert",(ulong)uVar3,"add node");
                        return uVar3;
                      }
                      dVar5 = pRStack_28[edge0] - pRStack_28[node2];
                      t0 = 0.5;
                      if (dVar5 * 1e+20 <= 0.0) {
                        local_2b8 = -(dVar5 * 1e+20);
                      }
                      else {
                        local_2b8 = dVar5 * 1e+20;
                      }
                      if (pRStack_28[node2] <= 0.0) {
                        local_2c8 = -pRStack_28[node2];
                      }
                      else {
                        local_2c8 = pRStack_28[node2];
                      }
                      if (local_2c8 < local_2b8) {
                        t0 = -pRStack_28[node2] / dVar5;
                      }
                      dVar5 = 1.0 - t0;
                      *(double *)
                       (*(long *)(ref_edge->e2n + 0xe) + (long)(_part[new_cell] * 0xf) * 8) =
                           t0 * *(double *)
                                 (*(long *)((long)field_local[1] + 0x38) + (long)(edge0 * 0xf) * 8)
                           + dVar5 * *(double *)
                                      (*(long *)((long)field_local[1] + 0x38) +
                                      (long)(node2 * 0xf) * 8);
                      *(double *)
                       (*(long *)(ref_edge->e2n + 0xe) + (long)(_part[new_cell] * 0xf + 1) * 8) =
                           t0 * *(double *)
                                 (*(long *)((long)field_local[1] + 0x38) +
                                 (long)(edge0 * 0xf + 1) * 8) +
                           dVar5 * *(double *)
                                    (*(long *)((long)field_local[1] + 0x38) +
                                    (long)(node2 * 0xf + 1) * 8);
                      *(double *)
                       (*(long *)(ref_edge->e2n + 0xe) + (long)(_part[new_cell] * 0xf + 2) * 8) =
                           t0 * *(double *)
                                 (*(long *)((long)field_local[1] + 0x38) +
                                 (long)(edge0 * 0xf + 2) * 8) +
                           dVar5 * *(double *)
                                    (*(long *)((long)field_local[1] + 0x38) +
                                    (long)(node2 * 0xf + 2) * 8);
                    }
                  }
                }
              }
              uVar3 = ref_node_shift_new_globals((REF_NODE)ref_edge->e2n);
              if (uVar3 == 0) {
                uVar3 = ref_iso_ghost((REF_GRID)ref_edge,(REF_EDGE)new_node,_part);
                if (uVar3 == 0) {
                  uVar3 = ref_iso_interp((REF_GRID)ref_edge,(REF_EDGE)new_node,_part,pRStack_28,
                                         in_local._4_4_,(REF_DBL *)out_local,(REF_DBL **)ref_mpi);
                  if (uVar3 == 0) {
                    if (*(int *)(field_local + 0x21) == 0) {
                      pRVar1 = (REF_CELL)field_local[10];
                      for (local_b4 = 0; local_b4 < pRVar1->max; local_b4 = local_b4 + 1) {
                        RVar4 = ref_cell_nodes(pRVar1,local_b4,new_nodes + 0x1a);
                        if (RVar4 == 0) {
                          tri_nodes[0x19] = 0;
                          for (local_1e4 = 0; local_1e4 < pRVar1->edge_per;
                              local_1e4 = local_1e4 + 1) {
                            uVar3 = ref_edge_with((REF_EDGE)new_node,
                                                  pRVar1->c2n
                                                  [pRVar1->e2n[local_1e4 << 1] +
                                                   pRVar1->size_per * local_b4],
                                                  pRVar1->c2n
                                                  [pRVar1->e2n[local_1e4 * 2 + 1] +
                                                   pRVar1->size_per * local_b4],&new_cell);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                     ,0xf5,"ref_iso_insert",(ulong)uVar3,"cell edge");
                              return uVar3;
                            }
                            tri_nodes[(long)local_1e4 + 0x1a] = _part[new_cell];
                            if (tri_nodes[(long)local_1e4 + 0x1a] != -1) {
                              (&ref_private_macro_code_rss)[tri_nodes[0x19]] =
                                   tri_nodes[(long)local_1e4 + 0x1a];
                              tri_nodes[0x19] = tri_nodes[0x19] + 1;
                            }
                          }
                          if (tri_nodes[0x19] != 0) {
                            if (tri_nodes[0x19] == 3) {
                              new_nodes[1] = 1;
                              uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                   &ref_private_macro_code_rss,&node1);
                              if (uVar3 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                       ,0x103,"ref_iso_insert",(ulong)uVar3,"add");
                                return uVar3;
                              }
                            }
                            else {
                              if (tri_nodes[0x19] != 4) {
                                printf("nedge %d\n",(ulong)(uint)tri_nodes[0x19]);
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                       ,0x13c,"ref_iso_insert",6,
                                       "implement iso surface tet intersection");
                                return 6;
                              }
                              bVar2 = false;
                              if ((tri_nodes[0x1a] == -1) && (edge_nodes[3] == -1)) {
                                bVar2 = true;
                                tri_nodes[1] = 1;
                                uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                     &ref_private_macro_code_rss_16,&node1);
                                if (uVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x10f,"ref_iso_insert",(ulong)uVar3,"add");
                                  return uVar3;
                                }
                                tri_nodes[1] = 1;
                                uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                     &ref_private_macro_code_rss_16,&node1);
                                if (uVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x115,"ref_iso_insert",(ulong)uVar3,"add");
                                  return uVar3;
                                }
                              }
                              if ((nedge == -1) && (edge_nodes[2] == -1)) {
                                if (bVar2) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x118,"ref_iso_insert","found twice");
                                  return 1;
                                }
                                bVar2 = true;
                                ref_private_macro_code_rss_16 = tri_nodes[0x1a];
                                tri_nodes[1] = 1;
                                uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                     &ref_private_macro_code_rss_16,&node1);
                                if (uVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x11f,"ref_iso_insert",(ulong)uVar3,"add");
                                  return uVar3;
                                }
                                tri_nodes[1] = 1;
                                uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                     &ref_private_macro_code_rss_16,&node1);
                                if (uVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x125,"ref_iso_insert",(ulong)uVar3,"add");
                                  return uVar3;
                                }
                              }
                              if ((edge_nodes[0] == -1) && (edge_nodes[1] == -1)) {
                                if (bVar2) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x128,"ref_iso_insert","found twice");
                                  return 1;
                                }
                                bVar2 = true;
                                ref_private_macro_code_rss_16 = tri_nodes[0x1a];
                                tri_nodes[1] = 1;
                                uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                     &ref_private_macro_code_rss_16,&node1);
                                if (uVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x12f,"ref_iso_insert",(ulong)uVar3,"add");
                                  return uVar3;
                                }
                                tri_nodes[1] = 1;
                                uVar3 = ref_cell_add((REF_CELL)ref_edge[1].e2n,
                                                     &ref_private_macro_code_rss_16,&node1);
                                if (uVar3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                         ,0x135,"ref_iso_insert",(ulong)uVar3,"add");
                                  return uVar3;
                                }
                              }
                              if (!bVar2) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                       ,0x137,"ref_iso_insert","not found");
                                return 1;
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      pRVar1 = (REF_CELL)field_local[5];
                      for (local_b4 = 0; local_b4 < pRVar1->max; local_b4 = local_b4 + 1) {
                        RVar4 = ref_cell_nodes(pRVar1,local_b4,new_nodes + 0x1a);
                        if (RVar4 == 0) {
                          uVar3 = ref_edge_with((REF_EDGE)new_node,local_124,nodes[0],&edge2);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                   ,0xd0,"ref_iso_insert",(ulong)uVar3,"e0");
                            return uVar3;
                          }
                          uVar3 = ref_edge_with((REF_EDGE)new_node,nodes[0],new_nodes[0x1a],
                                                &local_80);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                   ,0xd1,"ref_iso_insert",(ulong)uVar3,"e1");
                            return uVar3;
                          }
                          uVar3 = ref_edge_with((REF_EDGE)new_node,new_nodes[0x1a],local_124,
                                                (REF_INT *)((long)&global + 4));
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                   ,0xd2,"ref_iso_insert",(ulong)uVar3,"e2");
                            return uVar3;
                          }
                          node2 = _part[edge2];
                          edge0 = _part[local_80];
                          edge1 = _part[global._4_4_];
                          if (((node2 == -1) && (edge0 != -1)) && (edge1 != -1)) {
                            new_nodes[0] = 1;
                            ref_private_macro_code_rss = edge0;
                            id = edge1;
                            uVar3 = ref_cell_add((REF_CELL)ref_edge->adj,&ref_private_macro_code_rss
                                                 ,&node1);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                     ,0xda,"ref_iso_insert",(ulong)uVar3,"add");
                              return uVar3;
                            }
                          }
                          if (((node2 != -1) && (edge0 == -1)) && (edge1 != -1)) {
                            ref_private_macro_code_rss = edge1;
                            id = node2;
                            new_nodes[0] = 1;
                            uVar3 = ref_cell_add((REF_CELL)ref_edge->adj,&ref_private_macro_code_rss
                                                 ,&node1);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                     ,0xe0,"ref_iso_insert",(ulong)uVar3,"add");
                              return uVar3;
                            }
                          }
                          if (((node2 != -1) && (edge0 != -1)) && (edge1 == -1)) {
                            ref_private_macro_code_rss = node2;
                            id = edge0;
                            new_nodes[0] = 1;
                            uVar3 = ref_cell_add((REF_CELL)ref_edge->adj,&ref_private_macro_code_rss
                                                 ,&node1);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                     ,0xe6,"ref_iso_insert",(ulong)uVar3,"add");
                              return uVar3;
                            }
                          }
                        }
                      }
                    }
                    if (_part != (REF_INT *)0x0) {
                      free(_part);
                    }
                    ref_edge_free((REF_EDGE)new_node);
                    iso_grid_ptr_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                           ,0xcb,"ref_iso_insert",(ulong)uVar3,"interp in to out");
                    iso_grid_ptr_local._4_4_ = uVar3;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,200,"ref_iso_insert",(ulong)uVar3,"new ghost");
                  iso_grid_ptr_local._4_4_ = uVar3;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0xc6,"ref_iso_insert",(ulong)uVar3,"shift iso glob");
                iso_grid_ptr_local._4_4_ = uVar3;
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0xa5,"ref_iso_insert",(ulong)uVar3,"create edge");
          iso_grid_ptr_local._4_4_ = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xa3,
               "ref_iso_insert",(ulong)uVar3,"zero glob");
        iso_grid_ptr_local._4_4_ = uVar3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0xa1,
             "ref_iso_insert",(ulong)uVar3,"create");
      iso_grid_ptr_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x9f,
           "ref_iso_insert",(ulong)uVar3,"sync glob");
    iso_grid_ptr_local._4_4_ = uVar3;
  }
  return iso_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_insert(REF_GRID *iso_grid_ptr, REF_GRID ref_grid,
                                  REF_DBL *field, REF_INT ldim, REF_DBL *in,
                                  REF_DBL **out) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GRID iso_grid;
  REF_EDGE ref_edge;
  REF_INT *new_node;
  REF_INT edge, part, new_cell;
  REF_INT node0, node1, node2;
  REF_INT edge0, edge1, edge2;
  REF_GLOB global;
  REF_DBL t1, t0, d;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id = 1;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      if (MAX(field[node0], field[node1]) > 0.0 &&
          MIN(field[node0], field[node1]) < 0.0) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        d = field[node1] - field[node0];
        t1 = 0.5;
        if (ref_math_divisible(field[node0], d)) {
          t1 = -field[node0] / d;
        }
        t0 = 1.0 - t1;
        /*printf("%f %f d %f t %f\n",field[node0],field[node1],d,t);*/
        ref_node_xyz(ref_grid_node(iso_grid), 0, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 0, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 0, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 1, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 1, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 1, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 2, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 2, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 2, node0);
      }
    }
  }
  RSS(ref_node_shift_new_globals(ref_grid_node(iso_grid)), "shift iso glob");

  RSS(ref_iso_ghost(iso_grid, ref_edge, new_node), "new ghost");

  RSS(ref_iso_interp(iso_grid, ref_edge, new_node, field, ldim, in, out),
      "interp in to out");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge0), "e0");
      RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge1), "e1");
      RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge2), "e2");
      node0 = new_node[edge0];
      node1 = new_node[edge1];
      node2 = new_node[edge2];
      if (REF_EMPTY == node0 && REF_EMPTY != node1 && REF_EMPTY != node2) {
        new_nodes[0] = node1;
        new_nodes[1] = node2;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY == node1 && REF_EMPTY != node2) {
        new_nodes[0] = node2;
        new_nodes[1] = node0;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY != node1 && REF_EMPTY == node2) {
        new_nodes[0] = node0;
        new_nodes[1] = node1;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    REF_INT cell_edge;
    REF_INT edge_nodes[6];
    REF_INT nedge;
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_BOOL found;
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                          ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
            "cell edge");
        edge_nodes[cell_edge] = new_node[edge];
        if (REF_EMPTY != edge_nodes[cell_edge]) {
          new_nodes[nedge] = edge_nodes[cell_edge];
          nedge++;
        }
      }
      switch (nedge) {
        case 0:
          /* cell is not intersected by iso surface */
          break;
        case 3:
          new_nodes[3] = id;
          RSS(ref_cell_add(ref_grid_tri(iso_grid), new_nodes, &new_cell),
              "add");
          break;
        case 4:
          found = REF_FALSE;
          if (REF_EMPTY == edge_nodes[0] && REF_EMPTY == edge_nodes[5]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[2];
            tri_nodes[2] = edge_nodes[4];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[3];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[1] && REF_EMPTY == edge_nodes[4]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[2];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[2];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[2] && REF_EMPTY == edge_nodes[3]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[1];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          RAS(found, "not found");
          break;

        default:
          printf("nedge %d\n", nedge);
          RSS(REF_IMPLEMENT, "implement iso surface tet intersection");
          break;
      }
    }
  }

  ref_free(new_node);
  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}